

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuParamsVal(dstu_params *params)

{
  err_t eVar1;
  bool_t bVar2;
  size_t sVar3;
  word *in_RDI;
  void *stack;
  ec_o *ec;
  void *in_stack_00000010;
  err_t code;
  dstu_deep_i in_stack_00000068;
  dstu_params *in_stack_00000070;
  ec_o **in_stack_00000078;
  void *stack_00;
  ec_o *ec_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  ec_00 = (ec_o *)0x0;
  eVar1 = dstuEcCreate(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  if (eVar1 == 0) {
    stack_00 = (void *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
    sVar3 = wwBitSize((word *)ec_00,(size_t)stack_00);
    if ((((sVar3 < 0xa1) || (bVar2 = ec2IsValid(ec_00,stack_00), bVar2 == 0)) ||
        (bVar2 = ec2SeemsValidGroup((ec_o *)params,in_stack_00000010), bVar2 == 0)) ||
       ((bVar2 = ec2IsSafeGroup(ec,(size_t)stack,
                                (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                )), bVar2 == 0 ||
        (bVar2 = ecHasOrderA((word *)stack,
                             (ec_o *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI,CONCAT44(eVar1,in_stack_ffffffffffffffe8),ec_00), bVar2 == 0))))
    {
      eVar1 = 0x1f6;
    }
    dstuEcClose((ec_o *)0x174dc6);
  }
  return eVar1;
}

Assistant:

err_t dstuParamsVal(const dstu_params* params)
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuParamsVal_deep);
	ERR_CALL_CHECK(code);
	stack = objEnd(ec, void);
	// проверить кривую и базовую точку
	if (wwBitSize(ec->order, ec->f->n) <= 160 ||
		!ec2IsValid(ec, stack) ||
		!ec2SeemsValidGroup(ec, stack) ||
		!ec2IsSafeGroup(ec, 32, stack) ||
		!ecHasOrderA(ec->base, ec, ec->order, ec->f->n, stack))
		code = ERR_BAD_PARAMS;
	// завершение
	dstuEcClose(ec);
	return code;
}